

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void kratos::InlineGeneratorVisitor::optimize_passthrough_assignment
               (Generator *gen,
               vector<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
               *stmts)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  **__args;
  __node_base_ptr *__args_00;
  pointer pPVar1;
  Var *pVVar2;
  long lVar3;
  Var *var;
  pointer ppVVar4;
  int iVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  **ppuVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  **ppuVar7;
  PortInfo *info;
  pointer pPVar8;
  Var *pVVar9;
  undefined8 *puVar10;
  undefined1 local_d8 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  var_mapping;
  RenameLinkedVar v;
  Var *right;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  
  Generator::set_use_stmt_remove_cache(gen,true);
  local_d8 = (undefined1  [8])&var_mapping._M_h._M_rehash_policy._M_next_resize;
  var_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  var_mapping._M_h._M_bucket_count = 0;
  var_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  var_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  var_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  var_mapping._M_h._M_rehash_policy._4_4_ = 0;
  var_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  right = (Var *)0x0;
  vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar8 = (stmts->
           super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (stmts->
           super__Vector_base<kratos::InlineGeneratorVisitor::PortInfo,_std::allocator<kratos::InlineGeneratorVisitor::PortInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar8 != pPVar1) {
    __args = &v.var_mapping_;
    __args_00 = &var_mapping._M_h._M_single_bucket;
    do {
      var_mapping._M_h._M_single_bucket = (__node_base_ptr)pPVar8->stmt->left_;
      v.var_mapping_ =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
            *)pPVar8->stmt->right_;
      if (pPVar8->direction == In) {
        Var::move_sink_to((Var *)var_mapping._M_h._M_single_bucket,(Var *)v.var_mapping_,gen,false);
        (*(code *)(var_mapping._M_h._M_single_bucket)->_M_nxt[0x12]._M_nxt)
                  (var_mapping._M_h._M_single_bucket,1);
        std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                  ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&right,(Var **)__args);
        ppuVar6 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                   **)__args_00;
        ppuVar7 = __args;
      }
      else {
        Var::move_src_to((Var *)v.var_mapping_,(Var *)var_mapping._M_h._M_single_bucket,gen,false);
        (*(code *)((v.var_mapping_)->_M_h)._M_buckets[0x11])(v.var_mapping_,1);
        std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                  ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)&right,(Var **)__args_00);
        ppuVar6 = __args;
        ppuVar7 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
                   **)__args_00;
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,kratos::Var*&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_d8,&(*ppuVar6)[2]._M_h._M_bucket_count,ppuVar7);
      pPVar8 = pPVar8 + 1;
    } while (pPVar8 != pPVar1);
  }
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  v.super_IRVisitor._8_8_ = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  var_mapping._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002bd9f8;
  v.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)local_d8;
  IRVisitor::visit_content_s((IRVisitor *)&var_mapping._M_h._M_single_bucket,gen);
  for (puVar10 = (undefined8 *)var_mapping._M_h._M_bucket_count;
      ppVVar4 = vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                super__Vector_impl_data._M_start, pVVar9 = right, puVar10 != (undefined8 *)0x0;
      puVar10 = (undefined8 *)*puVar10) {
    Generator::remove_var(gen,(string *)(puVar10 + 1));
  }
  for (; pVVar9 != (Var *)ppVVar4; pVVar9 = (Var *)&(pVVar9->super_IRNode).fn_name_ln) {
    pVVar2 = (Var *)(pVVar9->super_IRNode)._vptr_IRNode;
    iVar5 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x10])(pVVar2);
    if (*(long *)(CONCAT44(extraout_var,iVar5) + 0x18) == 1) {
      iVar5 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x10])(pVVar2);
      lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x10) + 8);
      var = *(Var **)(lVar3 + 0xc0);
      if ((var == pVVar2) && (pVVar2 = *(Var **)(lVar3 + 200), (pVVar2->type_ & ~PortIO) == Base)) {
        Var::move_sink_to(var,pVVar2,gen,false);
        (*(var->super_IRNode)._vptr_IRNode[0x12])(var,1);
        Generator::remove_var(gen,&var->name);
      }
    }
  }
  Generator::clear_remove_stmt_cache(gen);
  Generator::set_use_stmt_remove_cache(gen,false);
  var_mapping._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002b4ad8;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&v.super_IRVisitor.level);
  if (right != (Var *)0x0) {
    operator_delete(right,(long)vars.
                                super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)right);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_d8);
  return;
}

Assistant:

static void optimize_passthrough_assignment(Generator* gen,
                                                const std::vector<PortInfo>& stmts) {
        gen->set_use_stmt_remove_cache(true);
        std::unordered_map<std::string, Var*> var_mapping;
        std::vector<Var*> vars;
        for (auto const& info : stmts) {
            auto* stmt = info.stmt;
            auto* left = stmt->left();
            auto* right = stmt->right();
            if (info.direction == PortDirection::In) {
                // move to right
                Var::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                vars.emplace_back(right);
                var_mapping.emplace(left->name, right);
            } else {
                // move to left
                Var::move_src_to(right, left, gen, false);
                right->clear_sinks(true);
                vars.emplace_back(left);
                var_mapping.emplace(right->name, left);
            }
        }

        // rename some constructs that's not assignments
        RenameLinkedVar v(var_mapping);
        v.visit_content_s(gen);
        // now remove them
        for (auto const& iter : var_mapping) {
            gen->remove_var(iter.first);
        }

        // also clear out variables with only one source
        // notice that we keep track of the ones need to check for performance reason
        for (auto* var : vars) {
            if (var->sources().size() != 1) {
                continue;
            }

            auto const& src_stmt = *var->sources().begin();
            auto* left = src_stmt->left();
            auto* right = src_stmt->right();
            if (left != var) continue;
            if (right->type() == VarType::PortIO || right->type() == VarType::Base) {
                // move
                VarSlice::move_sink_to(left, right, gen, false);
                left->clear_sources(true);
                gen->remove_var(left->name);
            }
        }

        gen->clear_remove_stmt_cache();
        gen->set_use_stmt_remove_cache(false);
    }